

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O0

char * __thiscall
Memory::LargeHeapBucket::TryAllocFromExplicitFreeList
          (LargeHeapBucket *this,Recycler *recycler,size_t sizeCat,ObjectInfoBits attributes)

{
  HeapInfo *pHVar1;
  code *pcVar2;
  char *this_00;
  bool bVar3;
  undefined4 *puVar4;
  size_t sVar5;
  FreeObject *pFVar6;
  HeapBlock *pHVar7;
  LargeHeapBlock *heapBlock;
  LargeObjectHeader *dbgHeader;
  LargeHeapBlock *largeHeapBlock;
  HeapBlock *heapBlockVerify;
  LargeObjectHeader *header;
  char *memBlock;
  FreeObject *prevFreeObject;
  FreeObject *currFreeObject;
  char *pcStack_28;
  ObjectInfoBits attributes_local;
  size_t sizeCat_local;
  Recycler *recycler_local;
  LargeHeapBucket *this_local;
  
  currFreeObject._6_2_ = attributes;
  pcStack_28 = (char *)sizeCat;
  sizeCat_local = (size_t)recycler;
  recycler_local = (Recycler *)this;
  if ((attributes & InternalObjectInfoBitMask) != attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x196,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  prevFreeObject = this->explicitFreeList;
  memBlock = (char *)0x0;
  while( true ) {
    if (prevFreeObject == (FreeObject *)0x0) {
      return (char *)0x0;
    }
    header = (LargeObjectHeader *)prevFreeObject;
    heapBlockVerify = (HeapBlock *)LargeHeapBlock::GetHeaderFromAddress(prevFreeObject);
    if ((heapBlockVerify->isPendingConcurrentSweep >> 3 & 1U) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0x19e,"(header->isExplicitFreed)","header->isExplicitFreed");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    sVar5 = HeapInfo::GetMediumObjectAlignedSizeNoCheck((size_t)heapBlockVerify->address);
    if (sVar5 != (this->super_HeapBucket).sizeCat) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0x19f,
                         "(HeapInfo::GetMediumObjectAlignedSizeNoCheck(header->objectSize) == this->sizeCat)"
                         ,
                         "HeapInfo::GetMediumObjectAlignedSizeNoCheck(header->objectSize) == this->sizeCat"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_00 = memBlock;
    if (pcStack_28 <= heapBlockVerify->address) break;
    memBlock = (char *)prevFreeObject;
    prevFreeObject = FreeObject::GetNext(prevFreeObject);
  }
  heapBlockVerify->isPendingConcurrentSweep =
       (bool)(heapBlockVerify->isPendingConcurrentSweep & 0xf7);
  if (memBlock == (char *)0x0) {
    pFVar6 = FreeObject::GetNext(prevFreeObject);
    this->explicitFreeList = pFVar6;
  }
  else {
    pFVar6 = FreeObject::GetNext(prevFreeObject);
    FreeObject::SetNext((FreeObject *)this_00,pFVar6);
  }
  largeHeapBlock = (LargeHeapBlock *)Recycler::FindHeapBlock((Recycler *)sizeCat_local,header);
  if (largeHeapBlock == (LargeHeapBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1b3,"(heapBlockVerify != nullptr)","heapBlockVerify != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar3 = HeapBlock::IsLargeHeapBlock(&largeHeapBlock->super_HeapBlock);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1b4,"(heapBlockVerify->IsLargeHeapBlock())",
                       "heapBlockVerify->IsLargeHeapBlock()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  dbgHeader = (LargeObjectHeader *)largeHeapBlock;
  bVar3 = LargeHeapBlock::GetObjectHeader(largeHeapBlock,header,(LargeObjectHeader **)&heapBlock);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1b7,"(largeHeapBlock->GetObjectHeader(memBlock, &dbgHeader))",
                       "largeHeapBlock->GetObjectHeader(memBlock, &dbgHeader)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (heapBlock != (LargeHeapBlock *)heapBlockVerify) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1b8,"(dbgHeader == header)","dbgHeader == header");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  FreeObject::DebugFillNext((FreeObject *)header);
  memset(header,0,8);
  LargeObjectHeader::SetAttributes
            ((LargeObjectHeader *)heapBlockVerify,*(uint *)sizeCat_local,(uchar)currFreeObject._6_2_
            );
  if ((currFreeObject._6_2_ & FinalizeBit) != NoBit) {
    pHVar7 = Recycler::FindHeapBlock((Recycler *)sizeCat_local,header);
    *(int *)((long)&pHVar7[4].address + 4) = *(int *)((long)&pHVar7[4].address + 4) + 1;
    pHVar1 = (this->super_HeapBucket).heapInfo;
    pHVar1->liveFinalizableObjectCount = pHVar1->liveFinalizableObjectCount + 1;
    pHVar1 = (this->super_HeapBucket).heapInfo;
    pHVar1->newFinalizableObjectCount = pHVar1->newFinalizableObjectCount + 1;
  }
  return (char *)header;
}

Assistant:

char *
LargeHeapBucket::TryAllocFromExplicitFreeList(Recycler * recycler, size_t sizeCat, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    FreeObject * currFreeObject = this->explicitFreeList;
    FreeObject * prevFreeObject = nullptr;
    while (currFreeObject != nullptr)
    {
        char * memBlock = (char *)currFreeObject;
        LargeObjectHeader * header = LargeHeapBlock::GetHeaderFromAddress(memBlock);
        Assert(header->isExplicitFreed);
        Assert(HeapInfo::GetMediumObjectAlignedSizeNoCheck(header->objectSize) == this->sizeCat);
        if (header->objectSize < sizeCat)
        {
            prevFreeObject = currFreeObject;
            currFreeObject = currFreeObject->GetNext();
            continue;
        }

        DebugOnly(header->isExplicitFreed = false);
        if (prevFreeObject)
        {
            prevFreeObject->SetNext(currFreeObject->GetNext());
        }
        else
        {
            this->explicitFreeList = currFreeObject->GetNext();
        }

#ifdef RECYCLER_MEMORY_VERIFY
        HeapBlock* heapBlockVerify = recycler->FindHeapBlock(memBlock);
        Assert(heapBlockVerify != nullptr);
        Assert(heapBlockVerify->IsLargeHeapBlock());
        LargeHeapBlock * largeHeapBlock = (LargeHeapBlock *)heapBlockVerify;
        LargeObjectHeader * dbgHeader;
        Assert(largeHeapBlock->GetObjectHeader(memBlock, &dbgHeader));
        Assert(dbgHeader == header);

        ((FreeObject *)memBlock)->DebugFillNext();
#endif
#ifdef RECYCLER_ZERO_MEM_CHECK
        // TODO: large heap block doesn't separate leaf object on to different page allocator.
        // so all the memory should still be zeroed.
        memset(memBlock, 0, sizeof(FreeObject));
#endif
        header->SetAttributes(recycler->Cookie, (attributes & StoredObjectInfoBitMask));

        if ((attributes & ObjectInfoBits::FinalizeBit) != 0)
        {
            LargeHeapBlock* heapBlock = (LargeHeapBlock *)recycler->FindHeapBlock(memBlock);
            heapBlock->finalizeCount++;
#ifdef RECYCLER_FINALIZE_CHECK
            heapInfo->liveFinalizableObjectCount++;
            heapInfo->newFinalizableObjectCount++;
#endif
        }
        return memBlock;
    }

    return nullptr;
}